

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void print_options(void)

{
  wchar_t wVar1;
  char *pcVar2;
  nh_menuitem_conflict *items;
  long *plVar3;
  ulong uVar4;
  nh_menuitem *_item_;
  wchar_t wVar5;
  long lVar6;
  ulong uVar7;
  wchar_t wVar8;
  nh_option_desc *pnVar9;
  char buf [256];
  char acStack_138 [264];
  
  items = (nh_menuitem_conflict *)malloc(0xa78);
  items->id = L'\0';
  items->role = MI_HEADING;
  items->accel = '\0';
  items->group_accel = '\0';
  items->selected = '\0';
  builtin_strncpy(items->caption,"Birth options:",0xf);
  plVar3 = (long *)nh_get_options(0);
  if (*plVar3 == 0) {
    wVar5 = L'\n';
    uVar7 = 1;
  }
  else {
    wVar5 = L'\n';
    uVar7 = 1;
    lVar6 = 0x216;
    do {
      plVar3 = plVar3 + 6;
      snprintf(acStack_138,0x100,"%s\t%s");
      if ((long)wVar5 <= (long)uVar7) {
        wVar5 = wVar5 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
      }
      pcVar2 = items->caption + lVar6 + -8;
      *(undefined8 *)(pcVar2 + -0x10a) = 0;
      *(undefined2 *)(pcVar2 + -2) = MI_TEXT >> 0x10;
      *pcVar2 = '\0';
      strcpy(pcVar2 + -0x102,acStack_138);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10c;
    } while (*plVar3 != 0);
    if (wVar5 <= (wchar_t)uVar7) {
      wVar5 = wVar5 * 2;
      items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
    }
  }
  uVar4 = uVar7 & 0xffffffff;
  items[uVar4].accel = '\0';
  items[uVar4].group_accel = '\0';
  items[uVar4].selected = '\0';
  wVar8 = (int)uVar7 + L'\x01';
  items[uVar4].caption[0] = '\0';
  items[uVar4].id = L'\0';
  items[uVar4].role = MI_TEXT;
  if (wVar5 <= wVar8) {
    wVar5 = wVar5 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
  }
  items[(uint)wVar8].id = L'\0';
  items[(uint)wVar8].role = MI_HEADING;
  items[(uint)wVar8].accel = '\0';
  items[(uint)wVar8].group_accel = '\0';
  items[(uint)wVar8].selected = '\0';
  builtin_strncpy(items[(uint)wVar8].caption,"Game opt",8);
  builtin_strncpy(items[(uint)wVar8].caption + 6,"ptions:",8);
  wVar8 = (int)uVar7 + L'\x02';
  plVar3 = (long *)nh_get_options(2);
  if (*plVar3 != 0) {
    lVar6 = (ulong)(uint)wVar8 * 0x10c + 0x10a;
    do {
      plVar3 = plVar3 + 6;
      snprintf(acStack_138,0x100,"%s\t%s");
      if (wVar5 <= wVar8) {
        wVar5 = wVar5 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
      }
      pcVar2 = items->caption + lVar6 + -8;
      *(undefined8 *)(pcVar2 + -0x10a) = 0;
      *(undefined2 *)(pcVar2 + -2) = MI_TEXT >> 0x10;
      *pcVar2 = '\0';
      strcpy(pcVar2 + -0x102,acStack_138);
      wVar8 = wVar8 + L'\x01';
      lVar6 = lVar6 + 0x10c;
    } while (*plVar3 != 0);
  }
  if (wVar5 <= wVar8) {
    wVar5 = wVar5 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
  }
  items[(uint)wVar8].accel = '\0';
  items[(uint)wVar8].group_accel = '\0';
  items[(uint)wVar8].selected = '\0';
  wVar1 = wVar8 + L'\x01';
  items[(uint)wVar8].caption[0] = '\0';
  items[(uint)wVar8].id = L'\0';
  items[(uint)wVar8].role = MI_TEXT;
  if (wVar5 <= wVar1) {
    wVar5 = wVar5 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
  }
  items[(uint)wVar1].id = L'\0';
  items[(uint)wVar1].role = MI_HEADING;
  items[(uint)wVar1].accel = '\0';
  items[(uint)wVar1].group_accel = '\0';
  items[(uint)wVar1].selected = '\0';
  builtin_strncpy(items[(uint)wVar1].caption,"Interface option",0x10);
  builtin_strncpy(items[(uint)wVar1].caption + 0xf,"ns:",4);
  wVar8 = wVar8 + L'\x02';
  if (curses_options[0].name != (char *)0x0) {
    lVar6 = (ulong)(uint)wVar8 * 0x10c + 0x10a;
    pnVar9 = curses_options;
    do {
      pnVar9 = pnVar9 + 1;
      snprintf(acStack_138,0x100,"%s\t%s");
      if (wVar5 <= wVar8) {
        wVar5 = wVar5 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar5 * 0x10c);
      }
      pcVar2 = items->caption + lVar6 + -8;
      *(undefined8 *)(pcVar2 + -0x10a) = 0;
      *(undefined2 *)(pcVar2 + -2) = MI_TEXT >> 0x10;
      *pcVar2 = '\0';
      strcpy(pcVar2 + -0x102,acStack_138);
      wVar8 = wVar8 + L'\x01';
      lVar6 = lVar6 + 0x10c;
    } while (pnVar9->name != (char *)0x0);
  }
  curses_display_menu(items,wVar8,"Available options:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void print_options(void)
{
    struct nh_menuitem *items;
    int i, icount, size;
    char buf[BUFSZ];
    struct nh_option_desc *options;

    icount = 0; size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
    options = nh_get_options(CURRENT_BIRTH_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
    options = nh_get_options(GAME_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);

    /* add UI specific options */
    add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
    for (i = 0; curses_options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", curses_options[i].name, curses_options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }

    curses_display_menu(items, icount, "Available options:", PICK_NONE, NULL);
    free(items);
}